

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTimeCoordinator.hpp
# Opt level: O2

void __thiscall helics::GlobalTimeCoordinator::GlobalTimeCoordinator(GlobalTimeCoordinator *this)

{
  BaseTimeCoordinator::BaseTimeCoordinator(&this->super_BaseTimeCoordinator);
  (this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator =
       (_func_int **)&PTR__BaseTimeCoordinator_00466738;
  (this->currentMinTime).internalTimeCode = -0x7fffffffffffffff;
  this->currentTimeState = initialized;
  (this->nextEvent).internalTimeCode = 0x7fffffffffffffff;
  this->iterating = false;
  this->mNewRequest = true;
  return;
}

Assistant:

GlobalTimeCoordinator() = default;